

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QControlledGate2.hpp
# Opt level: O2

SquareMatrix<float> __thiscall
qclab::qgates::QControlledGate2<float>::matrix(QControlledGate2<float> *this)

{
  long lVar1;
  int iVar2;
  long *plVar3;
  data_type extraout_RDX;
  long *in_RSI;
  data_type *this_00;
  SquareMatrix<float> SVar4;
  SquareMatrix<float> SStack_a8;
  matrix_type CG;
  matrix_type E1;
  matrix_type E0;
  matrix_type I2;
  SquareMatrix<float> local_58;
  SquareMatrix<float> local_48;
  SquareMatrix<float> local_38;
  SquareMatrix<float> local_28;
  
  dense::eye<float>((dense *)&I2,2);
  dense::SquareMatrix<float>::SquareMatrix(&E0,1.0,0.0,0.0,0.0);
  dense::SquareMatrix<float>::SquareMatrix(&E1,0.0,0.0,0.0,1.0);
  plVar3 = (long *)(**(code **)(*in_RSI + 0x80))();
  (**(code **)(*plVar3 + 0x38))(&CG,plVar3);
  lVar1 = in_RSI[1];
  if (*(int *)((long)in_RSI + 0xc) == 0) {
    iVar2 = (**(code **)(*in_RSI + 0x78))();
    if ((int)lVar1 < iVar2) {
      dense::kron<float>((dense *)&local_28,&E0,&CG);
      dense::kron<float>((dense *)&SStack_a8,&E1,&I2);
      dense::operator+((dense *)this,&local_28,&SStack_a8);
      this_00 = &local_28.data_;
    }
    else {
      dense::kron<float>((dense *)&local_38,&CG,&E0);
      dense::kron<float>((dense *)&SStack_a8,&I2,&E1);
      dense::operator+((dense *)this,&local_38,&SStack_a8);
      this_00 = &local_38.data_;
    }
  }
  else {
    iVar2 = (**(code **)(*in_RSI + 0x78))();
    if ((int)lVar1 < iVar2) {
      dense::kron<float>((dense *)&local_48,&E0,&I2);
      dense::kron<float>((dense *)&SStack_a8,&E1,&CG);
      dense::operator+((dense *)this,&local_48,&SStack_a8);
      this_00 = &local_48.data_;
    }
    else {
      dense::kron<float>((dense *)&local_58,&I2,&E0);
      dense::kron<float>((dense *)&SStack_a8,&CG,&E1);
      dense::operator+((dense *)this,&local_58,&SStack_a8);
      this_00 = &local_58.data_;
    }
  }
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr(&SStack_a8.data_);
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr(this_00);
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr(&CG.data_);
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr(&E1.data_);
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr(&E0.data_);
  std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr(&I2.data_);
  SVar4.data_._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl =
       extraout_RDX._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
       super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
       super__Head_base<0UL,_float_*,_false>._M_head_impl;
  SVar4.size_ = (size_type_conflict)this;
  return SVar4;
}

Assistant:

qclab::dense::SquareMatrix< T > matrix() const override {
          using matrix_type = qclab::dense::SquareMatrix< T > ;
          const matrix_type  I2 = qclab::dense::eye< T >( 2 ) ;
          const matrix_type  E0( 1 , 0 ,
                                 0 , 0 ) ;
          const matrix_type  E1( 0 , 0 ,
                                 0 , 1 ) ;
          const matrix_type  CG = this->gate()->matrix() ;
          if ( controlState_ == 0 ) {
            if ( control() < target() ) {
              return qclab::dense::kron( E0 , CG ) +
                     qclab::dense::kron( E1 , I2 ) ;
            } else {
              return qclab::dense::kron( CG , E0 ) +
                     qclab::dense::kron( I2 , E1 ) ;
            }
          } else {
            if ( control() < target() ) {
              return qclab::dense::kron( E0 , I2 ) +
                     qclab::dense::kron( E1 , CG ) ;
            } else {
              return qclab::dense::kron( I2 , E0 ) +
                     qclab::dense::kron( CG , E1 ) ;
            }
          }
        }